

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::convert_triangles_to_quads(Ref<embree::SceneGraph::Node> *node,float prop)

{
  long *plVar1;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  size_type sVar6;
  reference pvVar7;
  Ref<embree::SceneGraph::TriangleMeshNode> *in_RSI;
  Node *in_RDI;
  float in_XMM0_Da;
  Ref<embree::SceneGraph::TriangleMeshNode> tmesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  long *local_400;
  long *local_390;
  long *local_330;
  long *local_2d0;
  Node *local_288;
  ulong local_280;
  long local_268;
  long local_250;
  float prop_00;
  undefined4 in_stack_fffffffffffffdd0;
  Ref<embree::SceneGraph::TriangleMeshNode> *pRVar8;
  
  pRVar8 = in_RSI;
  if (in_RSI->ptr == (TriangleMeshNode *)0x0) {
    local_2d0 = (long *)0x0;
  }
  else {
    local_2d0 = (long *)__dynamic_cast(in_RSI->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (local_2d0 != (long *)0x0) {
    (**(code **)(*local_2d0 + 0x10))();
  }
  prop_00 = (float)((ulong)local_2d0 >> 0x20);
  if (local_2d0 == (long *)0x0) {
    if (in_RSI->ptr == (TriangleMeshNode *)0x0) {
      local_330 = (long *)0x0;
    }
    else {
      local_330 = (long *)__dynamic_cast(in_RSI->ptr,&Node::typeinfo,&MultiTransformNode::typeinfo,0
                                        );
    }
    if (local_330 == (long *)0x0) {
      if (in_RSI->ptr == (TriangleMeshNode *)0x0) {
        local_390 = (long *)0x0;
      }
      else {
        local_390 = (long *)__dynamic_cast(in_RSI->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (local_390 == (long *)0x0) {
        if (in_RSI->ptr == (TriangleMeshNode *)0x0) {
          local_400 = (long *)0x0;
        }
        else {
          local_400 = (long *)__dynamic_cast(in_RSI->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo
                                             ,0);
        }
        if (local_400 == (long *)0x0) {
          bVar3 = false;
        }
        else {
          (**(code **)(*local_400 + 0x10))();
          iVar4 = rand();
          if (in_XMM0_Da < (float)iVar4 / 2.1474836e+09) {
            (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)in_RSI->ptr;
            in_RSI->ptr = (TriangleMeshNode *)0x0;
            bVar3 = true;
          }
          else {
            if (local_400 != (long *)0x0) {
              (**(code **)(*local_400 + 0x10))();
            }
            convert_triangles_to_quads(pRVar8);
            if (local_400 != (long *)0x0) {
              (**(code **)(*local_400 + 0x18))();
            }
            bVar3 = true;
          }
        }
        if (local_400 != (long *)0x0) {
          (**(code **)(*local_400 + 0x18))();
        }
        if (!bVar3) goto LAB_001d8e00;
      }
      else {
        (**(code **)(*local_390 + 0x10))();
        for (local_280 = 0;
            sVar6 = std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            *)(local_390 + 0xd)), local_280 < sVar6; local_280 = local_280 + 1) {
          pvVar7 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_390 + 0xd),local_280);
          pNVar2 = pvVar7->ptr;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
          }
          convert_triangles_to_quads
                    ((Ref<embree::SceneGraph::Node> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffdd0)
                     ,prop_00);
          pvVar7 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_390 + 0xd),local_280);
          if (pvVar7->ptr != (Node *)0x0) {
            (*(pvVar7->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pvVar7->ptr = local_288;
          local_288 = (Node *)0x0;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
          }
        }
LAB_001d8e00:
        bVar3 = false;
      }
      if (local_390 != (long *)0x0) {
        (**(code **)(*local_390 + 0x18))();
      }
      if (!bVar3) goto LAB_001d8e9c;
    }
    else {
      (**(code **)(*local_330 + 0x10))();
      plVar1 = (long *)local_330[0x10];
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x10))();
      }
      convert_triangles_to_quads
                ((Ref<embree::SceneGraph::Node> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffdd0),
                 prop_00);
      plVar5 = local_330 + 0x10;
      if (*plVar5 != 0) {
        (**(code **)(*(long *)*plVar5 + 0x18))();
      }
      *plVar5 = local_268;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x18))();
      }
LAB_001d8e9c:
      bVar3 = false;
    }
    if (local_330 != (long *)0x0) {
      (**(code **)(*local_330 + 0x18))();
    }
    if (bVar3) goto LAB_001d8f46;
  }
  else {
    plVar1 = (long *)local_2d0[0x13];
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x10))();
    }
    convert_triangles_to_quads
              ((Ref<embree::SceneGraph::Node> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffdd0),
               prop_00);
    plVar5 = local_2d0 + 0x13;
    if (*plVar5 != 0) {
      (**(code **)(*(long *)*plVar5 + 0x18))();
    }
    *plVar5 = local_250;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x18))();
    }
  }
  bVar3 = false;
LAB_001d8f46:
  if (local_2d0 != (long *)0x0) {
    (**(code **)(*local_2d0 + 0x18))();
  }
  if (!bVar3) {
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)in_RSI->ptr;
    in_RSI->ptr = (TriangleMeshNode *)0x0;
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_triangles_to_quads(Ref<SceneGraph::Node> node, float prop)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_triangles_to_quads(xfmNode->child,prop);
    } 
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_triangles_to_quads(xfmNode->child,prop);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_triangles_to_quads(groupNode->children[i],prop);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> tmesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
      if (random<float>() <= prop) return convert_triangles_to_quads(tmesh);
      else                         return node;
    }
    return node;
  }